

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

ListSegment *
duckdb::CreateStructSegment
          (ListSegmentFunctions *functions,ArenaAllocator *allocator,uint16_t capacity)

{
  undefined8 uVar1;
  ListSegment *pLVar2;
  const_reference pvVar3;
  ListSegment *pLVar4;
  undefined6 in_register_00000012;
  size_type __n;
  ulong uVar5;
  value_type child_function;
  ListSegmentFunctions local_68;
  
  uVar5 = CONCAT62(in_register_00000012,capacity) & 0xffffffff;
  pLVar2 = (ListSegment *)
           ArenaAllocator::Allocate
                     (allocator,
                      uVar5 + ((ulong)((long)(functions->child_functions).
                                             super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                             .
                                             super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(functions->child_functions).
                                            super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                            .
                                            super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              0x6db6db6db6db6db8 + 0x17 & 0xfffffffffffffff8);
  pLVar2->capacity = (uint16_t)uVar5;
  pLVar2->count = 0;
  pLVar2->next = (ListSegment *)0x0;
  if ((functions->child_functions).
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (functions->child_functions).
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::ListSegmentFunctions,_true>::operator[]
                         (&functions->child_functions,__n);
      local_68.create_segment = pvVar3->create_segment;
      uVar1 = *(undefined8 *)((long)&pvVar3->write_data + 2);
      local_68._18_8_ = *(undefined8 *)((long)&pvVar3->read_data + 2);
      local_68.write_data._0_2_ = SUB82(pvVar3->write_data,0);
      local_68.write_data._2_6_ = (undefined6)uVar1;
      local_68.read_data._0_2_ = (undefined2)((ulong)uVar1 >> 0x30);
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      vector(&local_68.child_functions.
              super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             ,&(pvVar3->child_functions).
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
            );
      pLVar4 = (*local_68.create_segment)(&local_68,allocator,capacity);
      *(ListSegment **)((long)&pLVar2[1].count + __n * 8 + uVar5) = pLVar4;
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      ~vector(&local_68.child_functions.
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             );
      __n = __n + 1;
    } while (__n < (ulong)(((long)(functions->child_functions).
                                  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                  .
                                  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(functions->child_functions).
                                  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                  .
                                  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  return pLVar2;
}

Assistant:

static ListSegment *CreateStructSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                                        uint16_t capacity) {
	// allocate data and set header
	auto segment =
	    reinterpret_cast<ListSegment *>(AllocateStructData(allocator, capacity, functions.child_functions.size()));
	segment->capacity = capacity;
	segment->count = 0;
	segment->next = nullptr;

	// create a child ListSegment with exactly the same capacity for each child vector
	auto child_segments = GetStructData(segment);
	for (idx_t i = 0; i < functions.child_functions.size(); i++) {
		auto child_function = functions.child_functions[i];
		auto child_segment = child_function.create_segment(child_function, allocator, capacity);
		Store<ListSegment *>(child_segment, data_ptr_cast(child_segments + i));
	}

	return segment;
}